

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O3

void rnd_pcg_seed(rnd_pcg_t *pcg,uint seed)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)seed * -0x15ca0502554e666 + 0xff51afd7ed558ccd;
  uVar1 = uVar1 >> 0x21 ^ uVar1;
  uVar2 = uVar1 * -0x1288180e36f55d89;
  uVar1 = uVar1 * -0x3b314601e57a13ad;
  uVar1 = uVar1 >> 0x21 ^ uVar1;
  pcg->state[1] = uVar1 * 2 + 1;
  uVar2 = (uVar2 >> 0x21 ^ uVar2) * -0x3b314601e57a13ad;
  pcg->state[0] =
       (uVar2 >> 0x21 ^ uVar2) * 0x5851f42d4c957f2d + uVar1 * -0x4f5c17a566d501a4 +
       0x5851f42d4c957f2e;
  return;
}

Assistant:

void rnd_pcg_seed( rnd_pcg_t* pcg, RND_U32 seed )
    {
    RND_U64 value = ( ( (RND_U64) seed ) << 1ULL ) | 1ULL;
    value = rnd_internal_murmur3_avalanche64( value );
    pcg->state[ 0 ] = 0U;
    pcg->state[ 1 ] = ( value << 1ULL ) | 1ULL;
    rnd_pcg_next( pcg );
    pcg->state[ 0 ] += rnd_internal_murmur3_avalanche64( value );
    rnd_pcg_next( pcg );
    }